

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# grid.cpp
# Opt level: O0

int __thiscall Grid::operator()(Grid *this,point p)

{
  bool bVar1;
  cg_box *pcVar2;
  int *piVar3;
  cg_other *this_00;
  Grid *this_local;
  point p_local;
  
  pcVar2 = refc<cg_box>::operator->(&this->box);
  bVar1 = cg_box::contains(pcVar2,p);
  if (bVar1) {
    pcVar2 = refc<cg_box>::operator->(&this->box);
    piVar3 = cg_box::at(pcVar2,p);
    p_local.x = *piVar3;
  }
  else {
    this_00 = refc<cg_other>::operator*(&this->other);
    p_local.x = cg_other::operator()(this_00,p);
  }
  return p_local.x;
}

Assistant:

int Grid::operator()(point p) {
    if (box->contains(p)) {
        return box->at(p);
    }
    return (*other)(p);
}